

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

ulong __thiscall
testing::internal::FunctionMockerBase<TestColumnSizeHandler_()>::PerformDefaultAction
          (FunctionMockerBase<TestColumnSizeHandler_()> *this,ArgumentTuple *args,
          string *call_description)

{
  uint uVar1;
  OnCallSpec<TestColumnSizeHandler_()> *this_00;
  Action<TestColumnSizeHandler_()> *this_01;
  ulong uVar2;
  runtime_error *this_02;
  string message;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<TestColumnSizeHandler_()> *)0x0) {
    this_01 = OnCallSpec<TestColumnSizeHandler_()>::GetAction(this_00);
    uVar2 = Action<TestColumnSizeHandler_()>::Perform(this_01,args);
    return uVar2;
  }
  std::operator+(&message,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<TestColumnSizeHandler>::value_ != 0) {
    uVar1 = DefaultValue<TestColumnSizeHandler>::Get();
    std::__cxx11::string::~string((string *)&message);
    return (ulong)uVar1;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)&message);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }